

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O0

void __thiscall test_cpp_db_sqlite::test_result_emptys::test_method(test_result_emptys *this)

{
  unit_test_log_t *this_00;
  bool bVar1;
  element_type *conn;
  lazy_ostream *prev;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c8;
  assertion_result local_a8;
  basic_cstring<const_char> local_90;
  basic_cstring<const_char> local_80 [2];
  allocator<char> local_59;
  string local_58;
  statement local_38;
  result r;
  test_result_emptys *this_local;
  
  r.result_impl._M_t.
  super___uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>.
  _M_t.
  super__Tuple_impl<0UL,_cpp_db::result_interface_*,_std::default_delete<cpp_db::result_interface>_>
  .super__Head_base<0UL,_cpp_db::result_interface_*,_false>._M_head_impl =
       (unique_ptr<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>)
       (unique_ptr<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"select COL1, COL2 from TEST_TABLE where col1 = ?",&local_59);
  conn = std::__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
  cpp_db::statement::statement(&local_38,&local_58,conn);
  cpp_db::statement::execute<char_const(&)[13]>
            ((statement *)&stack0xffffffffffffffe8,(char (*) [13])&local_38);
  cpp_db::statement::~statement(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_90);
    boost::unit_test::unit_test_log_t::set_checkpoint(this_00,local_80,0xa9,&local_90);
    bVar1 = cpp_db::result::is_eof((result *)&stack0xffffffffffffffe8);
    boost::test_tools::assertion_result::assertion_result(&local_a8,bVar1);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,"r.is_eof()",10);
    boost::unit_test::operator<<(&local_c8,prev,&local_d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion
              (&local_a8,&local_c8.super_lazy_ostream,&local_e8,0xa9,CHECK,CHECK_PRED,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c8);
    boost::test_tools::assertion_result::~assertion_result(&local_a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  cpp_db::result::~result((result *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_result_emptys)
{
    cpp_db::result r(cpp_db::statement("select COL1, COL2 from TEST_TABLE where col1 = ?", *con).execute("empty result"));
    BOOST_CHECK(r.is_eof());

}